

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.c
# Opt level: O0

int assert_roundtrip(int flags,char *src)

{
  int iVar1;
  size_t srclen_00;
  size_t srclen;
  size_t tmplen;
  char tmp [1500];
  char *src_local;
  int flags_local;
  
  unique0x1000010f = src;
  srclen_00 = strlen(src);
  base64_encode(stack0xffffffffffffffe8,srclen_00,out,&outlen,flags);
  iVar1 = base64_decode(out,outlen,(char *)&tmplen,&srclen,flags);
  if (iVar1 == 0) {
    printf("FAIL: decoding of \'%s\': decoding error\n",out);
    src_local._4_4_ = 1;
  }
  else if (srclen_00 == srclen) {
    iVar1 = strncmp(stack0xffffffffffffffe8,(char *)&tmplen,srclen);
    if (iVar1 == 0) {
      src_local._4_4_ = 0;
    }
    else {
      tmp[srclen - 8] = '\0';
      printf("FAIL: roundtrip of \'%s\': got \'%s\'\n",stack0xffffffffffffffe8,&tmplen);
      src_local._4_4_ = 1;
    }
  }
  else {
    printf("FAIL: roundtrip of \'%s\': length expected %lu, got %lu\n",stack0xffffffffffffffe8,
           srclen_00,srclen);
    src_local._4_4_ = 1;
  }
  return src_local._4_4_;
}

Assistant:

static int
assert_roundtrip (int flags, const char *src)
{
	char tmp[1500];
	size_t tmplen;
	size_t srclen = strlen(src);

	// Encode the input into global buffer:
	base64_encode(src, srclen, out, &outlen, flags);

	// Decode the global buffer into local temp buffer:
	if (!base64_decode(out, outlen, tmp, &tmplen, flags)) {
		printf("FAIL: decoding of '%s': decoding error\n", out);
		return true;
	}

	// Check that 'src' is identical to 'tmp':
	if (srclen != tmplen) {
		printf("FAIL: roundtrip of '%s': "
			"length expected %lu, got %lu\n", src,
			(unsigned long)srclen,
			(unsigned long)tmplen
		);
		return true;
	}
	if (strncmp(src, tmp, tmplen) != 0) {
		tmp[tmplen] = '\0';
		printf("FAIL: roundtrip of '%s': got '%s'\n", src, tmp);
		return true;
	}

	return false;
}